

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

void fclose_comp(FILE *fp,int32 ispipe)

{
  if (ispipe != 0) {
    pclose((FILE *)fp);
    return;
  }
  fclose((FILE *)fp);
  return;
}

Assistant:

void
fclose_comp(FILE * fp, int32 ispipe)
{
    if (ispipe) {
#ifdef HAVE_POPEN
#if defined(_WIN32) && (!defined(__SYMBIAN32__))
        _pclose(fp);
#else
        pclose(fp);
#endif
#endif
    }
    else
        fclose(fp);
}